

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O2

void __thiscall flatbuffers::ToStringVisitor::EndSequence(ToStringVisitor *this)

{
  std::__cxx11::string::append((string *)&this->s);
  this->indent_level = this->indent_level - 1;
  append_indent(this);
  std::__cxx11::string::append((char *)&this->s);
  return;
}

Assistant:

void EndSequence() {
    s += d;
    indent_level--;
    append_indent();
    s += "}";
  }